

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandMfs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  Mfs_Par_t Pars;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Abc_NtkMfsParsDefault(&Pars);
  Extra_UtilGetoptReset();
LAB_001f4901:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"WFDMLCdraestpgvwh"), iVar2 = globalUtilOptind,
        iVar1 - 0x61U < 0x17) {
    piVar3 = &Pars.fRrOnly;
    switch(iVar1) {
    case 0x61:
      piVar3 = &Pars.fArea;
      break;
    default:
      goto switchD_001f4922_caseD_62;
    case 100:
      break;
    case 0x65:
      piVar3 = &Pars.fMoreEffort;
      break;
    case 0x67:
      piVar3 = &Pars.fGiaSat;
      break;
    case 0x70:
      piVar3 = &Pars.fPower;
      break;
    case 0x72:
      piVar3 = &Pars.fResub;
      break;
    case 0x73:
      piVar3 = &Pars.fSwapEdge;
      break;
    case 0x74:
      piVar3 = &Pars.fOneHotness;
      break;
    case 0x76:
      piVar3 = &Pars.fVerbose;
      break;
    case 0x77:
      piVar3 = &Pars.fVeryVerbose;
    }
    *(byte *)piVar3 = (byte)*piVar3 ^ 1;
  }
  switch(iVar1) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_001f4acf:
      Abc_Print(-1,pcVar4);
      goto switchD_001f4922_caseD_62;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nBTLimit = iVar1;
    break;
  case 0x44:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-D\" should be followed by an integer.\n";
      goto LAB_001f4acf;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nDepthMax = iVar1;
    break;
  case 0x45:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
    goto switchD_001f4922_caseD_62;
  case 0x46:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
      goto LAB_001f4acf;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nFanoutsMax = iVar1;
    break;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
      goto LAB_001f4acf;
    }
    Pars.nGrowthLevel = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if (1000000000 < (uint)Pars.nGrowthLevel) {
switchD_001f4922_caseD_62:
      iVar2 = -2;
      Abc_Print(-2,"usage: mfs [-WFDMLC <num>] [-draestpgvh]\n");
      Abc_Print(-2,"\t           performs don\'t-care-based optimization of logic networks\n");
      Abc_Print(-2,"\t-W <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",
                (ulong)(uint)Pars.nWinTfoLevs);
      Abc_Print(-2,"\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",
                (ulong)(uint)Pars.nFanoutsMax);
      Abc_Print(-2,"\t-D <num> : the max depth nodes to try (0 = no limit) [default = %d]\n",
                (ulong)(uint)Pars.nDepthMax);
      Abc_Print(-2,
                "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)Pars.nWinMax);
      Abc_Print(-2,
                "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n"
                ,(ulong)(uint)Pars.nGrowthLevel);
      Abc_Print(-2,
                "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)Pars.nBTLimit);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (Pars.fRrOnly == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d       : toggle performing redundancy removal [default = %s]\n",pcVar4);
      pcVar4 = "resub";
      if (Pars.fResub == 0) {
        pcVar4 = "dc-min";
      }
      Abc_Print(-2,"\t-r       : toggle resubstitution and dc-minimization [default = %s]\n",pcVar4)
      ;
      pcVar4 = "area";
      if (Pars.fArea == 0) {
        pcVar4 = "area+edges";
      }
      Abc_Print(-2,"\t-a       : toggle minimizing area or area+edges [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fMoreEffort == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-e       : toggle high-effort resubstitution [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fSwapEdge == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s       : toggle evaluation of edge swapping [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fOneHotness == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-t       : toggle using artificial one-hotness conditions [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (Pars.fPower == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-p       : toggle power-aware optimization [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fGiaSat == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-g       : toggle using new SAT solver [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar4);
      if (Pars.fVeryVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",
                pcVar5);
      pcVar4 = "\t-h       : print the command usage\n";
LAB_001f4cb9:
      Abc_Print(iVar2,pcVar4);
      return 1;
    }
    goto LAB_001f4901;
  case 0x4d:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-M\" should be followed by an integer.\n";
      goto LAB_001f4acf;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nWinMax = iVar1;
    break;
  default:
    if (iVar1 != 0x57) {
      if (iVar1 == -1) {
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else if (pNtk->ntkType == ABC_NTK_LOGIC) {
          iVar2 = Abc_NtkMfs(pNtk,&Pars);
          if (iVar2 != 0) {
            return 0;
          }
          pcVar4 = "Resynthesis has failed.\n";
        }
        else {
          pcVar4 = "This command can only be applied to a logic network.\n";
        }
        iVar2 = -1;
        goto LAB_001f4cb9;
      }
      goto switchD_001f4922_caseD_62;
    }
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
      goto LAB_001f4acf;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nWinTfoLevs = iVar1;
  }
  globalUtilOptind = iVar2 + 1;
  if (iVar1 < 0) goto switchD_001f4922_caseD_62;
  goto LAB_001f4901;
}

Assistant:

int Abc_CommandMfs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Mfs_Par_t Pars, * pPars = &Pars;
    int c;
    // set defaults
    Abc_NtkMfsParsDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WFDMLCdraestpgvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWinTfoLevs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWinTfoLevs < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFanoutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFanoutsMax < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDepthMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDepthMax < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWinMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWinMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nGrowthLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGrowthLevel < 0 || pPars->nGrowthLevel > ABC_INFINITY )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'd':
            pPars->fRrOnly ^= 1;
            break;
        case 'r':
            pPars->fResub ^= 1;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'e':
            pPars->fMoreEffort ^= 1;
            break;
        case 's':
            pPars->fSwapEdge ^= 1;
            break;
        case 't':
            pPars->fOneHotness ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 'g':
            pPars->fGiaSat ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }

    // modify the current network
    if ( !Abc_NtkMfs( pNtk, pPars ) )
    {
        Abc_Print( -1, "Resynthesis has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: mfs [-WFDMLC <num>] [-draestpgvh]\n" );
    Abc_Print( -2, "\t           performs don't-care-based optimization of logic networks\n" );
    Abc_Print( -2, "\t-W <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n", pPars->nWinTfoLevs );
    Abc_Print( -2, "\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n", pPars->nFanoutsMax );
    Abc_Print( -2, "\t-D <num> : the max depth nodes to try (0 = no limit) [default = %d]\n", pPars->nDepthMax );
    Abc_Print( -2, "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n", pPars->nWinMax );
    Abc_Print( -2, "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n", pPars->nGrowthLevel );
    Abc_Print( -2, "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-d       : toggle performing redundancy removal [default = %s]\n", pPars->fRrOnly? "yes": "no" );
    Abc_Print( -2, "\t-r       : toggle resubstitution and dc-minimization [default = %s]\n", pPars->fResub? "resub": "dc-min" );
    Abc_Print( -2, "\t-a       : toggle minimizing area or area+edges [default = %s]\n", pPars->fArea? "area": "area+edges" );
    Abc_Print( -2, "\t-e       : toggle high-effort resubstitution [default = %s]\n", pPars->fMoreEffort? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggle evaluation of edge swapping [default = %s]\n", pPars->fSwapEdge? "yes": "no" );
    Abc_Print( -2, "\t-t       : toggle using artificial one-hotness conditions [default = %s]\n", pPars->fOneHotness? "yes": "no" );
    Abc_Print( -2, "\t-p       : toggle power-aware optimization [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggle using new SAT solver [default = %s]\n", pPars->fGiaSat? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}